

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_minimal.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  initializer_list<std::array<float,_3UL>_> __l;
  neighbor<int,_float> nn;
  float query [3];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> points;
  max_leaf_size_t max_leaf_size;
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  tree;
  
  max_leaf_size.value = 0xc;
  tree.space_._M_data =
       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
       0x3f80000000000000;
  tree._8_8_ = 0x4040000040000000;
  tree.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40a0000040800000;
  __l._M_len = 2;
  __l._M_array = (iterator)&tree;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&points,__l,(allocator_type *)query);
  pico_tree::
  kd_tree<std::reference_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::reference_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,pico_tree::metric_l2_squared,int>
              *)&tree,&points,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&max_leaf_size,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)query,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&nn);
  query[0] = 4.0;
  query[1] = 4.0;
  query[2] = 4.0;
  pico_tree::
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  ::search_nn<float[3]>(&tree,&query,&nn);
  poVar1 = std::operator<<((ostream *)&std::cout,"Index closest point: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nn.index);
  std::endl<char,std::char_traits<char>>(poVar1);
  pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>::
  ~kd_tree_data(&tree.data_);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&points.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>);
  return 0;
}

Assistant:

int main() {
  pico_tree::max_leaf_size_t max_leaf_size = 12;
  std::vector<std::array<float, 3>> points{
      {0.0f, 1.0f, 2.0f}, {3.0f, 4.0f, 5.0f}};

  // The kd_tree takes the input by value. To prevent a copy, we can either move
  // the point set into the tree or the point set can be taken by reference by
  // wrapping it in an std::reference_wrapper. Below we take the input by
  // reference:
  pico_tree::kd_tree tree(std::ref(points), max_leaf_size);

  float query[3] = {4.0f, 4.0f, 4.0f};
  pico_tree::neighbor<int, float> nn;
  tree.search_nn(query, nn);

  std::cout << "Index closest point: " << nn.index << std::endl;

  return 0;
}